

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_setup(mbedtls_md_context_t *ctx,mbedtls_md_info_t *md_info,int hmac)

{
  void *pvVar1;
  int hmac_local;
  mbedtls_md_info_t *md_info_local;
  mbedtls_md_context_t *ctx_local;
  
  if (ctx == (mbedtls_md_context_t *)0x0) {
    ctx_local._4_4_ = -0x5100;
  }
  else if (md_info == (mbedtls_md_info_t *)0x0) {
    ctx_local._4_4_ = -0x5100;
  }
  else {
    ctx->md_info = md_info;
    ctx->md_ctx = (void *)0x0;
    ctx->hmac_ctx = (void *)0x0;
    if (md_info->type == MBEDTLS_MD_SHA224) {
      pvVar1 = calloc(1,0x6c);
      ctx->md_ctx = pvVar1;
      if (ctx->md_ctx == (void *)0x0) {
        return -0x5180;
      }
      mbedtls_sha256_init((mbedtls_sha256_context_conflict *)ctx->md_ctx);
    }
    else {
      if (md_info->type != MBEDTLS_MD_SHA256) {
        return -0x5100;
      }
      pvVar1 = calloc(1,0x6c);
      ctx->md_ctx = pvVar1;
      if (ctx->md_ctx == (void *)0x0) {
        return -0x5180;
      }
      mbedtls_sha256_init((mbedtls_sha256_context_conflict *)ctx->md_ctx);
    }
    if (hmac != 0) {
      pvVar1 = calloc(2,(ulong)md_info->block_size);
      ctx->hmac_ctx = pvVar1;
      if (ctx->hmac_ctx == (void *)0x0) {
        mbedtls_md_free(ctx);
        return -0x5180;
      }
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_md_setup(mbedtls_md_context_t *ctx, const mbedtls_md_info_t *md_info, int hmac)
{
#if defined(MBEDTLS_MD_C)
    if (ctx == NULL) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }
#endif
    if (md_info == NULL) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }

    ctx->md_info = md_info;
    ctx->md_ctx = NULL;
#if defined(MBEDTLS_MD_C)
    ctx->hmac_ctx = NULL;
#else
    if (hmac != 0) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }
#endif

#if defined(MBEDTLS_MD_SOME_PSA)
    if (md_can_use_psa(ctx->md_info)) {
        ctx->md_ctx = mbedtls_calloc(1, sizeof(psa_hash_operation_t));
        if (ctx->md_ctx == NULL) {
            return MBEDTLS_ERR_MD_ALLOC_FAILED;
        }
        ctx->engine = MBEDTLS_MD_ENGINE_PSA;
    } else
#endif
    switch (md_info->type) {
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_MD_MD5:
            ALLOC(md5);
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case MBEDTLS_MD_RIPEMD160:
            ALLOC(ripemd160);
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_MD_SHA1:
            ALLOC(sha1);
            break;
#endif
#if defined(MBEDTLS_SHA224_C)
        case MBEDTLS_MD_SHA224:
            ALLOC(sha256);
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_MD_SHA256:
            ALLOC(sha256);
            break;
#endif
#if defined(MBEDTLS_SHA384_C)
        case MBEDTLS_MD_SHA384:
            ALLOC(sha512);
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
        case MBEDTLS_MD_SHA512:
            ALLOC(sha512);
            break;
#endif
#if defined(MBEDTLS_SHA3_C)
        case MBEDTLS_MD_SHA3_224:
        case MBEDTLS_MD_SHA3_256:
        case MBEDTLS_MD_SHA3_384:
        case MBEDTLS_MD_SHA3_512:
            ALLOC(sha3);
            break;
#endif
        default:
            return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }

#if defined(MBEDTLS_MD_C)
    if (hmac != 0) {
        ctx->hmac_ctx = mbedtls_calloc(2, md_info->block_size);
        if (ctx->hmac_ctx == NULL) {
            mbedtls_md_free(ctx);
            return MBEDTLS_ERR_MD_ALLOC_FAILED;
        }
    }
#endif

    return 0;
}